

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# atom.cpp
# Opt level: O0

void __thiscall indigox::Atom::Clear(Atom *this)

{
  value_type_conflict *in_RDI;
  __weak_ptr<indigox::Molecule,_(__gnu_cxx::_Lock_policy)2> *unaff_retaddr;
  
  std::__weak_ptr<indigox::Molecule,_(__gnu_cxx::_Lock_policy)2>::reset(unaff_retaddr);
  std::__shared_ptr<indigox::Element,_(__gnu_cxx::_Lock_policy)2>::reset
            ((__shared_ptr<indigox::Element,_(__gnu_cxx::_Lock_policy)2> *)unaff_retaddr);
  std::vector<std::weak_ptr<indigox::Bond>,_std::allocator<std::weak_ptr<indigox::Bond>_>_>::clear
            ((vector<std::weak_ptr<indigox::Bond>,_std::allocator<std::weak_ptr<indigox::Bond>_>_> *
             )0x10b905);
  std::array<float,_3UL>::fill((array<float,_3UL> *)unaff_retaddr,in_RDI);
  return;
}

Assistant:

void Atom::Clear() {
    mol_.reset();
    element_.reset();
    bonds_.clear();
    pos_.fill(0.0);
  }